

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfPost.c
# Opt level: O0

void Cnf_ManFreeCuts(Cnf_Man_t *p)

{
  int iVar1;
  void *pvVar2;
  int local_1c;
  int i;
  Aig_Obj_t *pObj;
  Cnf_Man_t *p_local;
  
  for (local_1c = 0; iVar1 = Vec_PtrSize(p->pManAig->vObjs), local_1c < iVar1;
      local_1c = local_1c + 1) {
    pvVar2 = Vec_PtrEntry(p->pManAig->vObjs,local_1c);
    if ((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x28) != 0)) {
      Cnf_CutFree(*(Cnf_Cut_t **)((long)pvVar2 + 0x28));
      *(undefined8 *)((long)pvVar2 + 0x28) = 0;
    }
  }
  return;
}

Assistant:

void Cnf_ManFreeCuts( Cnf_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    Aig_ManForEachObj( p->pManAig, pObj, i )
        if ( pObj->pData )
        {
            Cnf_CutFree( (Cnf_Cut_t *)pObj->pData );
            pObj->pData = NULL;
        }
}